

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadCodePoint<true>
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *startingLocation,
          EncodedCharPtr endOfSource,codepoint_t *outChar,bool *hasEscape,
          bool *outContainsMultiUnitChar)

{
  code *pcVar1;
  bool bVar2;
  OLECHAR OVar3;
  undefined4 *puVar4;
  codepoint_t local_34 [2];
  codepoint_t ch;
  
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x172,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar2) goto LAB_00d5740e;
    *puVar4 = 0;
  }
  if (outContainsMultiUnitChar == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x173,"(outContainsMultiUnitChar != nullptr)",
                       "outContainsMultiUnitChar != nullptr");
    if (!bVar2) {
LAB_00d5740e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (*startingLocation < endOfSource) {
    OVar3 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                      (&this->super_UTF8EncodingPolicyBase<false>,startingLocation,endOfSource);
    local_34[0] = (codepoint_t)(ushort)OVar3;
    if ((ushort)OVar3 < 0x80) {
      if (((ushort)OVar3 == 0x5c) &&
         (bVar2 = TryReadEscape(this,startingLocation,endOfSource,local_34), bVar2)) {
        *hasEscape = true;
      }
    }
    else {
      *outContainsMultiUnitChar = true;
      if ((this->es6UnicodeMode == true) &&
         (bVar2 = Js::NumberUtilities::IsSurrogateLowerPart(local_34[0]), bVar2)) {
        bVar2 = TryReadCodePointRest<true>
                          (this,(uint)(ushort)OVar3,startingLocation,endOfSource,outChar,
                           outContainsMultiUnitChar);
        return bVar2;
      }
    }
    *outChar = local_34[0];
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool Scanner<EncodingPolicy>::TryReadCodePoint(EncodedCharPtr &startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar, bool *hasEscape, bool *outContainsMultiUnitChar)
{
    Assert(outChar != nullptr);
    Assert(outContainsMultiUnitChar != nullptr);

    if (startingLocation >= endOfSource)
    {
        return false;
    }

    codepoint_t ch = this->template ReadFull<bScan>(startingLocation, endOfSource);
    if (FBigChar(ch))
    {
        if (this->IsMultiUnitChar(static_cast<OLECHAR>(ch)))
        {
            *outContainsMultiUnitChar = true;
        }

        if (es6UnicodeMode && Js::NumberUtilities::IsSurrogateLowerPart(ch))
        {
            return TryReadCodePointRest<bScan>(ch, startingLocation, endOfSource, outChar, outContainsMultiUnitChar);
        }
    }
    else if (ch == '\\' && TryReadEscape(startingLocation, endOfSource, &ch))
    {
        *hasEscape = true;
    }

    *outChar = ch;
    return true;
}